

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

int __thiscall Lodtalk::StackInterpreterProxy::returnTop(StackInterpreterProxy *this)

{
  StackInterpreterProxy *this_local;
  
  StackInterpreter::returnTop(this->interpreter);
  return 0;
}

Assistant:

int StackInterpreterProxy::returnTop()
{
    interpreter->returnTop();
    return 0;
}